

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool __thiscall cmGeneratorTarget::HasImportLibrary(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  ManagedType MVar2;
  
  if (this->DLLPlatform != true) {
    return false;
  }
  if ((this->Target->TargetTypeValue != SHARED_LIBRARY) &&
     (bVar1 = IsExecutableWithExports(this), !bVar1)) {
    return false;
  }
  MVar2 = GetManagedType(this,config);
  return MVar2 != Managed;
}

Assistant:

bool cmGeneratorTarget::HasImportLibrary(std::string const& config) const
{
  return (this->IsDLLPlatform() &&
          (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
           this->IsExecutableWithExports()) &&
          // Assemblies which have only managed code do not have
          // import libraries.
          this->GetManagedType(config) != ManagedType::Managed);
}